

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::InvalidateSubFboUnbindReadCase::compare
          (InvalidateSubFboUnbindReadCase *this,Surface *reference,Surface *result)

{
  TestLog *log;
  bool bVar1;
  RGBA RVar2;
  ConstPixelBufferAccess local_78;
  ConstPixelBufferAccess local_50;
  
  RVar2 = FboTestUtil::getFormatThreshold(this->m_colorFmt);
  RVar2 = tcu::max(RVar2,(RGBA)0xc0c0c0c);
  log = ((this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::Surface::getAccess(&local_50,reference);
  tcu::Surface::getAccess(&local_78,result);
  bVar1 = tcu::bilinearCompare
                    (log,"Result","Image comparison result",&local_50,&local_78,RVar2,
                     COMPARE_LOG_RESULT);
  return bVar1;
}

Assistant:

bool compare (const tcu::Surface& reference, const tcu::Surface& result)
	{
		const tcu::RGBA threshold (tcu::max(getFormatThreshold(m_colorFmt), tcu::RGBA(12, 12, 12, 12)));

		return tcu::bilinearCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference.getAccess(), result.getAccess(), threshold, tcu::COMPARE_LOG_RESULT);
	}